

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

Ptr __thiscall Bind::ChoosePolymer(Bind *this)

{
  bool bVar1;
  int iVar2;
  VecPtr *pVVar3;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Ptr PVar4;
  double local_70;
  __shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_68;
  shared_ptr<Polymer> *polymer_1;
  const_iterator __end1;
  const_iterator __begin1;
  VecPtr *__range1;
  vector<double,_std::allocator<double>_> weights;
  SpeciesTracker *tracker;
  Bind *this_local;
  Ptr *polymer;
  
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)SpeciesTracker::Instance();
  __range1 = (VecPtr *)0x0;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&__range1);
  pVVar3 = SpeciesTracker::FindPolymers
                     ((SpeciesTracker *)
                      weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(string *)(in_RSI + 0x38));
  __end1 = std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::begin
                     (pVVar3);
  polymer_1 = (shared_ptr<Polymer> *)
              std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::end
                        (pVVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
                                     *)&polymer_1), bVar1) {
    local_68 = (__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
               ::operator*(&__end1);
    this_00 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_68);
    iVar2 = Polymer::uncovered(this_00,(string *)(in_RSI + 0x38));
    local_70 = (double)iVar2;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&__range1,&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Polymer>_*,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>
    ::operator++(&__end1);
  }
  pVVar3 = SpeciesTracker::FindPolymers
                     ((SpeciesTracker *)
                      weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(string *)(in_RSI + 0x38));
  Random::WeightedChoice<std::shared_ptr<Polymer>>
            ((Random *)this,pVVar3,(vector<double,_std::allocator<double>_> *)&__range1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__range1);
  PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Polymer::Ptr Bind::ChoosePolymer() {
  auto &tracker = SpeciesTracker::Instance();
  auto weights = std::vector<double>();
  for (const auto &polymer : tracker.FindPolymers(promoter_name_)) {
    weights.push_back(double(polymer->uncovered(promoter_name_)));
  }
  Polymer::Ptr polymer =
      Random::WeightedChoice(tracker.FindPolymers(promoter_name_), weights);
  return polymer;
}